

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O1

bool Js::CompoundString::TryAppendFewCharsGeneric<Js::CompoundString>
               (char16 *s,CharCount appendCharLength,CompoundString *toString)

{
  code *pcVar1;
  bool bVar2;
  CharCount CVar3;
  CharCount CVar4;
  charcount_t cVar5;
  undefined4 *puVar6;
  char16 *pcVar7;
  long lVar8;
  
  if (s == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,899,"(s)","s");
    if (!bVar2) goto LAB_00aa63af;
    *puVar6 = 0;
  }
  if (toString == (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,900,"(toString)","toString");
    if (!bVar2) goto LAB_00aa63af;
    *puVar6 = 0;
  }
  pcVar7 = JavascriptString::UnsafeGetBuffer((JavascriptString *)toString);
  if (pcVar7 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x385,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00aa63af;
    *puVar6 = 0;
  }
  bVar2 = OwnsLastBlock(toString);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x386,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_00aa63af;
    *puVar6 = 0;
  }
  bVar2 = HasOnlyDirectChars(toString);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x387,"(toString->HasOnlyDirectChars())",
                                "toString->HasOnlyDirectChars()");
    if (!bVar2) {
LAB_00aa63af:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  CVar3 = LastBlockCharLength(toString);
  CVar4 = LastBlockCharCapacity(toString);
  if (appendCharLength <= CVar4 - CVar3) {
    pcVar7 = LastBlockChars(toString);
    if (appendCharLength != 0) {
      lVar8 = 0;
      do {
        *(undefined2 *)((long)pcVar7 + lVar8 + (ulong)CVar3 * 2) = *(undefined2 *)((long)s + lVar8);
        lVar8 = lVar8 + 2;
      } while ((ulong)appendCharLength * 2 != lVar8);
    }
    cVar5 = JavascriptString::GetLength((JavascriptString *)toString);
    JavascriptString::SetLength((JavascriptString *)toString,cVar5 + appendCharLength);
    SetLastBlockCharLength(toString,CVar3 + appendCharLength);
  }
  return appendCharLength <= CVar4 - CVar3;
}

Assistant:

inline bool CompoundString::TryAppendFewCharsGeneric(
        __in_xcount(appendCharLength) const char16 *const s,
        const CharCount appendCharLength,
        String *const toString)
    {
        Assert(s);
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(toString->HasOnlyDirectChars());

        const CharCount blockCharLength = toString->LastBlockCharLength();
        if(appendCharLength <= toString->LastBlockCharCapacity() - blockCharLength)
        {
            const char16 *appendCharBuffer = s;
            char16 *charBuffer = &toString->LastBlockChars()[blockCharLength];
            const char16 *const charBufferEnd = charBuffer + appendCharLength;
            for(; charBuffer != charBufferEnd; ++appendCharBuffer, ++charBuffer)
                *charBuffer = *appendCharBuffer;
            toString->SetLength(toString->GetLength() + appendCharLength);
            toString->SetLastBlockCharLength(blockCharLength + appendCharLength);
            return true;
        }
        return false;
    }